

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::DXFImporter::ParseBlock(DXFImporter *this,LineReader *reader,FileData *output)

{
  int iVar1;
  pointer pBVar2;
  bool bVar3;
  LineReader *pLVar4;
  LineReader *reader_00;
  Logger *this_00;
  float fVar5;
  Block local_98;
  
  local_98.name._M_dataplus._M_p = (pointer)&local_98.name.field_2;
  local_98.name._M_string_length = 0;
  local_98.name.field_2._8_8_ = 0;
  local_98.base.z = 0.0;
  local_98._92_4_ = 0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.name.field_2._M_allocated_capacity = 0;
  local_98.base.x = 0.0;
  local_98.base.y = 0.0;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::
  emplace_back<Assimp::DXF::Block>(&output->blocks,&local_98);
  DXF::Block::~Block(&local_98);
  pBVar2 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (1 < reader->end) {
      return;
    }
    bVar3 = DXF::LineReader::Is(reader,0,"ENDBLK");
    if (bVar3) break;
    iVar1 = reader->groupcode;
    if (iVar1 == 2) {
      std::__cxx11::string::_M_assign((string *)&pBVar2[-1].name);
    }
    else if (iVar1 == 10) {
      fVar5 = DXF::LineReader::ValueAsFloat(reader);
      pBVar2[-1].base.x = fVar5;
    }
    else if (iVar1 == 0x14) {
      fVar5 = DXF::LineReader::ValueAsFloat(reader);
      pBVar2[-1].base.y = fVar5;
    }
    else if (iVar1 == 0x1e) {
      fVar5 = DXF::LineReader::ValueAsFloat(reader);
      pBVar2[-1].base.z = fVar5;
    }
    bVar3 = DXF::LineReader::Is(reader,0,"POLYLINE");
    if (bVar3) {
      pLVar4 = DXF::LineReader::operator++(reader);
      ParsePolyLine(this,pLVar4,output);
    }
    else {
      bVar3 = DXF::LineReader::Is(reader,0,"INSERT");
      if (bVar3) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"DXF: INSERT within a BLOCK not currently supported; skipping");
        while( true ) {
          if (1 < reader->end) {
            return;
          }
          bVar3 = DXF::LineReader::Is(reader,0,"ENDBLK");
          if (bVar3) break;
          DXF::LineReader::operator++(reader);
        }
        return;
      }
      bVar3 = DXF::LineReader::Is(reader,0,"3DFACE");
      if (((bVar3) || (bVar3 = DXF::LineReader::Is(reader,0,"LINE"), bVar3)) ||
         (bVar3 = DXF::LineReader::Is(reader,0,"3DLINE"), bVar3)) {
        pLVar4 = reader;
        reader_00 = DXF::LineReader::operator++(reader);
        Parse3DFace((DXFImporter *)pLVar4,reader_00,output);
      }
      else {
        DXF::LineReader::operator++(reader);
      }
    }
  }
  return;
}

Assistant:

void DXFImporter::ParseBlock(DXF::LineReader& reader, DXF::FileData& output) {
    // push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    while( !reader.End() && !reader.Is(0,"ENDBLK")) {

        switch(reader.GroupCode()) {
            case GroupCode_Name:
                block.name = reader.Value();
                break;

            case GroupCode_XComp:
                block.base.x = reader.ValueAsFloat();
                break;
            case GroupCode_YComp:
                block.base.y = reader.ValueAsFloat();
                break;
            case GroupCode_ZComp:
                block.base.z = reader.ValueAsFloat();
                break;
        }

        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        // XXX is this a valid case?
        if (reader.Is(0,"INSERT")) {
            ASSIMP_LOG_WARN("DXF: INSERT within a BLOCK not currently supported; skipping");
            for( ;!reader.End() && !reader.Is(0,"ENDBLK"); ++reader);
            break;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }
        ++reader;
    }
}